

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

bool __thiscall
fast_float::large_add_from<(unsigned_short)62>
          (fast_float *this,stackvec<(unsigned_short)62> *x,limb_span y,size_t start)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  uVar4 = y.length;
  puVar6 = y.ptr;
  if (((unsigned_long *)(*(ushort *)(this + 0x1f0) - uVar4) < puVar6 ||
       *(ushort *)(this + 0x1f0) < uVar4) &&
     (bVar3 = stackvec<(unsigned_short)62>::try_resize
                        ((stackvec<(unsigned_short)62> *)this,uVar4 + (long)puVar6,0), !bVar3)) {
    return false;
  }
  bVar3 = false;
  for (puVar5 = (unsigned_long *)0x0; puVar6 != puVar5; puVar5 = (unsigned_long *)((long)puVar5 + 1)
      ) {
    uVar1 = *(ulong *)(this + (long)puVar5 * 8 + uVar4 * 8);
    uVar2 = x->data[(long)puVar5];
    lVar7 = uVar1 + x->data[(long)puVar5];
    lVar8 = lVar7 + 1;
    lVar9 = lVar8;
    if (!bVar3) {
      lVar9 = lVar7;
    }
    *(long *)(this + (long)puVar5 * 8 + uVar4 * 8) = lVar9;
    bVar3 = (bool)(lVar8 == 0 & bVar3 | CARRY8(uVar1,uVar2));
  }
  if ((bVar3) &&
     (bVar3 = small_add_from<(unsigned_short)62>
                        ((stackvec<(unsigned_short)62> *)this,1,uVar4 + (long)puVar6), !bVar3)) {
    return false;
  }
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool large_add_from(stackvec<size>& x, limb_span y, size_t start) noexcept {
  // the effective x buffer is from `xstart..x.len()`, so exit early
  // if we can't get that current range.
  if (x.len() < start || y.len() > x.len() - start) {
      FASTFLOAT_TRY(x.try_resize(y.len() + start, 0));
  }

  bool carry = false;
  for (size_t index = 0; index < y.len(); index++) {
    limb xi = x[index + start];
    limb yi = y[index];
    bool c1 = false;
    bool c2 = false;
    xi = scalar_add(xi, yi, c1);
    if (carry) {
      xi = scalar_add(xi, 1, c2);
    }
    x[index + start] = xi;
    carry = c1 | c2;
  }

  // handle overflow
  if (carry) {
    FASTFLOAT_TRY(small_add_from(x, 1, y.len() + start));
  }
  return true;
}